

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

int __thiscall QPDFFormFieldObjectHelper::getFlags(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  int iVar2;
  QPDFObjectHandle f;
  allocator<char> local_39;
  QPDFObjectHandle local_38;
  string local_28 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_28,"/Ff",&local_39);
  getInheritableFieldValue((QPDFFormFieldObjectHelper *)&local_38,(string *)this);
  std::__cxx11::string::~string(local_28);
  bVar1 = QPDFObjectHandle::isInteger(&local_38);
  iVar2 = 0;
  if (bVar1) {
    iVar2 = QPDFObjectHandle::getIntValueAsInt(&local_38);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return iVar2;
}

Assistant:

int
QPDFFormFieldObjectHelper::getFlags()
{
    QPDFObjectHandle f = getInheritableFieldValue("/Ff");
    return f.isInteger() ? f.getIntValueAsInt() : 0;
}